

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolJPolValPair.cpp
# Opt level: O0

void __thiscall
PolicyPoolJPolValPair::Insert(PolicyPoolJPolValPair *this,PolicyPoolItemInterface_sharedPtr *ppi)

{
  bool bVar1;
  undefined8 uVar2;
  E *in_RSI;
  JointPolicyValuePair_sharedPtr jp;
  sp_nullptr_t in_stack_ffffffffffffffb8;
  shared_ptr<JointPolicyValuePair> *in_stack_ffffffffffffffc0;
  value_type *in_stack_ffffffffffffffd8;
  priority_queue<boost::shared_ptr<JointPolicyValuePair>,_std::vector<boost::shared_ptr<JointPolicyValuePair>,_std::allocator<boost::shared_ptr<JointPolicyValuePair>_>_>,_std::less<boost::shared_ptr<JointPolicyValuePair>_>_>
  *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  boost::dynamic_pointer_cast<JointPolicyValuePair,PolicyPoolItemInterface>
            ((shared_ptr<PolicyPoolItemInterface> *)in_stack_ffffffffffffffd8);
  bVar1 = boost::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (!bVar1) {
    std::
    priority_queue<boost::shared_ptr<JointPolicyValuePair>,_std::vector<boost::shared_ptr<JointPolicyValuePair>,_std::allocator<boost::shared_ptr<JointPolicyValuePair>_>_>,_std::less<boost::shared_ptr<JointPolicyValuePair>_>_>
    ::push(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    boost::shared_ptr<JointPolicyValuePair>::~shared_ptr
              ((shared_ptr<JointPolicyValuePair> *)0x97549c);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  E::E(in_RSI,in_stack_ffffffffffffffe8);
  __cxa_throw(uVar2,&E::typeinfo,E::~E);
}

Assistant:

void PolicyPoolJPolValPair::Insert(PolicyPoolItemInterface_sharedPtr  ppi)
{
    JointPolicyValuePair_sharedPtr jp = boost::dynamic_pointer_cast<JointPolicyValuePair>(ppi);

    if(jp==0)
        throw(E("PolicyPoolJPolValPair::Insert could not cast input to JointPolicyValuePair"));

    _m_jpvpQueue_p->push(jp);
    
}